

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::ConsoleReporter::printClosedHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  undefined8 in_RAX;
  size_t sVar2;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  printOpenHeader(this,_name);
  poVar1 = (ostream *)(this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  if (getLineOfChars<(char)46>()::line == '\0') {
    uRam000000000021c770 = 0x2e2e2e2e2e2e2e;
    uRam000000000021c777._0_1_ = '.';
    uRam000000000021c777._1_1_ = '.';
    uRam000000000021c777._2_1_ = '.';
    uRam000000000021c777._3_1_ = '.';
    uRam000000000021c777._4_1_ = '.';
    uRam000000000021c777._5_1_ = '.';
    uRam000000000021c777._6_1_ = '.';
    uRam000000000021c777._7_1_ = '.';
    DAT_0021c760 = '.';
    DAT_0021c760_1._0_1_ = '.';
    DAT_0021c760_1._1_1_ = '.';
    DAT_0021c760_1._2_1_ = '.';
    DAT_0021c760_1._3_1_ = '.';
    DAT_0021c760_1._4_1_ = '.';
    DAT_0021c760_1._5_1_ = '.';
    DAT_0021c760_1._6_1_ = '.';
    uRam000000000021c768 = 0x2e2e2e2e2e2e2e;
    DAT_0021c76f = 0x2e;
    DAT_0021c750 = '.';
    DAT_0021c750_1._0_1_ = '.';
    DAT_0021c750_1._1_1_ = '.';
    DAT_0021c750_1._2_1_ = '.';
    DAT_0021c750_1._3_1_ = '.';
    DAT_0021c750_1._4_1_ = '.';
    DAT_0021c750_1._5_1_ = '.';
    DAT_0021c750_1._6_1_ = '.';
    uRam000000000021c758._0_1_ = '.';
    uRam000000000021c758._1_1_ = '.';
    uRam000000000021c758._2_1_ = '.';
    uRam000000000021c758._3_1_ = '.';
    uRam000000000021c758._4_1_ = '.';
    uRam000000000021c758._5_1_ = '.';
    uRam000000000021c758._6_1_ = '.';
    uRam000000000021c758._7_1_ = '.';
    DAT_0021c740 = '.';
    DAT_0021c740_1._0_1_ = '.';
    DAT_0021c740_1._1_1_ = '.';
    DAT_0021c740_1._2_1_ = '.';
    DAT_0021c740_1._3_1_ = '.';
    DAT_0021c740_1._4_1_ = '.';
    DAT_0021c740_1._5_1_ = '.';
    DAT_0021c740_1._6_1_ = '.';
    uRam000000000021c748._0_1_ = '.';
    uRam000000000021c748._1_1_ = '.';
    uRam000000000021c748._2_1_ = '.';
    uRam000000000021c748._3_1_ = '.';
    uRam000000000021c748._4_1_ = '.';
    uRam000000000021c748._5_1_ = '.';
    uRam000000000021c748._6_1_ = '.';
    uRam000000000021c748._7_1_ = '.';
    getLineOfChars<(char)46>()::line = '.';
    getLineOfChars<(char)46>()::line_1._0_1_ = '.';
    getLineOfChars<(char)46>()::line_1._1_1_ = '.';
    getLineOfChars<(char)46>()::line_1._2_1_ = '.';
    getLineOfChars<(char)46>()::line_1._3_1_ = '.';
    getLineOfChars<(char)46>()::line_1._4_1_ = '.';
    getLineOfChars<(char)46>()::line_1._5_1_ = '.';
    getLineOfChars<(char)46>()::line_1._6_1_ = '.';
    uRam000000000021c738._0_1_ = '.';
    uRam000000000021c738._1_1_ = '.';
    uRam000000000021c738._2_1_ = '.';
    uRam000000000021c738._3_1_ = '.';
    uRam000000000021c738._4_1_ = '.';
    uRam000000000021c738._5_1_ = '.';
    uRam000000000021c738._6_1_ = '.';
    uRam000000000021c738._7_1_ = '.';
    DAT_0021c77f = 0;
  }
  sVar2 = strlen(&getLineOfChars<(char)46>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&getLineOfChars<(char)46>()::line,sVar2)
  ;
  uStack_18 = CONCAT17(10,(undefined7)uStack_18);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_18 + 7),1);
  return;
}

Assistant:

void ConsoleReporter::printClosedHeader(std::string const& _name) {
    printOpenHeader(_name);
    stream << getLineOfChars<'.'>() << '\n';
}